

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::CPattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,CPattern *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdPatternColorR5G6B5 *pMVar1;
  MthdPatternColorY8 *pMVar2;
  MthdPatternBitmap *pMVar3;
  MthdPatternBitmapColor *pMVar4;
  MthdPatternSelect *pMVar5;
  MthdPatternShape *pMVar6;
  MthdBitmapFormat *pMVar7;
  MthdCtxFormat *pMVar8;
  MthdMissing *pMVar9;
  MthdDmaNotify *pMVar10;
  MthdPmTrigger *pMVar11;
  MthdNotify *pMVar12;
  SingleMthdTest *pSVar13;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar14;
  result_type rVar15;
  MthdPatternColorR5G5B5 *this_01;
  MthdPatternColorR8G8B8 *this_02;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_36a;
  allocator local_369;
  allocator local_368;
  allocator local_367;
  allocator local_366;
  allocator local_365;
  allocator local_364;
  allocator local_363;
  allocator local_362;
  allocator local_361;
  allocator local_360;
  allocator local_35f;
  allocator local_35e;
  allocator local_35d;
  allocator local_35c;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  MthdPatternColorR5G6B5 *local_358;
  MthdPatternColorY8 *local_350;
  MthdPatternBitmap *local_348;
  MthdPatternBitmap *local_340;
  MthdPatternBitmapColor *local_338;
  MthdPatternBitmapColor *local_330;
  MthdPatternSelect *local_328;
  MthdPatternShape *local_320;
  MthdBitmapFormat *local_318;
  MthdCtxFormat *local_310;
  MthdMissing *local_308;
  MthdDmaNotify *local_300;
  MthdPmTrigger *local_2f8;
  MthdNotify *local_2f0;
  SingleMthdTest *local_2e8;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  SingleMthdTest *local_b8;
  MthdNotify *local_b0;
  MthdPmTrigger *local_a8;
  MthdDmaNotify *local_a0;
  MthdMissing *local_98;
  MthdCtxFormat *local_90;
  MthdBitmapFormat *local_88;
  MthdPatternShape *local_80;
  MthdPatternSelect *local_78;
  MthdPatternBitmapColor *local_70;
  MthdPatternBitmapColor *local_68;
  MthdPatternBitmap *local_60;
  MthdPatternBitmap *local_58;
  MthdPatternColorY8 *local_50;
  MthdPatternColorR5G6B5 *local_48;
  MthdPatternColorR5G5B5 *local_40;
  MthdPatternColorR8G8B8 *local_38;
  
  local_2e8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  local_2e0 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_d8,"nop",&local_359);
  pSVar13 = local_2e8;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_2e8,opt,(uint32_t)rVar15,&local_d8,-1,(this->super_Class).cls,0x100,1,
             4);
  local_b8 = pSVar13;
  local_2f0 = (MthdNotify *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f8,"notify",&local_35a);
  pMVar12 = local_2f0;
  MthdNotify::SingleMthdTest
            (local_2f0,opt,(uint32_t)rVar15,&local_f8,0,(this->super_Class).cls,0x104,1,4);
  local_b0 = pMVar12;
  local_2f8 = (MthdPmTrigger *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_118,"pm_trigger",&local_35b);
  pMVar11 = local_2f8;
  MthdPmTrigger::SingleMthdTest
            (local_2f8,opt,(uint32_t)rVar15,&local_118,-1,(this->super_Class).cls,0x140,1,4);
  local_a8 = pMVar11;
  local_300 = (MthdDmaNotify *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_138,"dma_notify",&local_35c);
  pMVar10 = local_300;
  MthdDmaNotify::SingleMthdTest
            (local_300,opt,(uint32_t)rVar15,&local_138,1,(this->super_Class).cls,0x180,1,4);
  local_a0 = pMVar10;
  local_308 = (MthdMissing *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_158,"missing",&local_35d);
  pMVar9 = local_308;
  MthdMissing::SingleMthdTest
            (local_308,opt,(uint32_t)rVar15,&local_158,-1,(this->super_Class).cls,0x200,1,4);
  local_98 = pMVar9;
  local_310 = (MthdCtxFormat *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_178,"format",&local_35e);
  pMVar8 = local_310;
  MthdCtxFormat::SingleMthdTest
            (local_310,opt,(uint32_t)rVar15,&local_178,2,(this->super_Class).cls,0x300,1,4);
  local_90 = pMVar8;
  local_318 = (MthdBitmapFormat *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_198,"bitmap_format",&local_35f);
  pMVar7 = local_318;
  MthdBitmapFormat::SingleMthdTest
            (local_318,opt,(uint32_t)rVar15,&local_198,3,(this->super_Class).cls,0x304,1,4);
  local_88 = pMVar7;
  local_320 = (MthdPatternShape *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b8,"pattern_shape",&local_360);
  pMVar6 = local_320;
  MthdPatternShape::SingleMthdTest
            (local_320,opt,(uint32_t)rVar15,&local_1b8,4,(this->super_Class).cls,0x308,1,4);
  local_80 = pMVar6;
  local_328 = (MthdPatternSelect *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d8,"pattern_select",&local_361);
  pMVar5 = local_328;
  MthdPatternSelect::SingleMthdTest
            (local_328,opt,(uint32_t)rVar15,&local_1d8,5,(this->super_Class).cls,0x30c,1,4);
  local_78 = pMVar5;
  local_330 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f8,"pattern_bitmap_color_0",&local_362);
  pMVar4 = local_330;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_330,opt,(uint32_t)rVar15,&local_1f8,6,(this->super_Class).cls,0x310,0);
  local_70 = pMVar4;
  local_338 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_218,"pattern_bitmap_color_1",&local_363);
  pMVar4 = local_338;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_338,opt,(uint32_t)rVar15,&local_218,7,(this->super_Class).cls,0x314,1);
  local_68 = pMVar4;
  local_340 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_238,"pattern_bitmap_0",&local_364);
  pMVar3 = local_340;
  MthdPatternBitmap::MthdPatternBitmap
            (local_340,opt,(uint32_t)rVar15,&local_238,8,(this->super_Class).cls,0x318,0);
  local_60 = pMVar3;
  local_348 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_258,"pattern_bitmap_1",&local_365);
  pMVar3 = local_348;
  MthdPatternBitmap::MthdPatternBitmap
            (local_348,opt,(uint32_t)rVar15,&local_258,9,(this->super_Class).cls,0x31c,1);
  local_58 = pMVar3;
  local_350 = (MthdPatternColorY8 *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_278,"pattern_color_y8",&local_366);
  pMVar2 = local_350;
  MthdPatternColorY8::SingleMthdTest
            (local_350,opt,(uint32_t)rVar15,&local_278,10,(this->super_Class).cls,0x400,0x10,4);
  local_50 = pMVar2;
  local_358 = (MthdPatternColorR5G6B5 *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_298,"pattern_color_r5g6b5",&local_367);
  pMVar1 = local_358;
  MthdPatternColorR5G6B5::SingleMthdTest
            (local_358,opt,(uint32_t)rVar15,&local_298,0xc,(this->super_Class).cls,0x500,0x20,4);
  local_48 = pMVar1;
  this_01 = (MthdPatternColorR5G5B5 *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2b8,"pattern_color_r5g5b5",&local_368);
  MthdPatternColorR5G5B5::SingleMthdTest
            (this_01,opt,(uint32_t)rVar15,&local_2b8,0xb,(this->super_Class).cls,0x600,0x20,4);
  local_40 = this_01;
  this_02 = (MthdPatternColorR8G8B8 *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2d8,"pattern_color_r8g8b8",&local_369);
  MthdPatternColorR8G8B8::SingleMthdTest
            (this_02,opt,(uint32_t)rVar15,&local_2d8,0xd,(this->super_Class).cls,0x700,0x40,4);
  pvVar14 = local_2e0;
  __l._M_len = 0x11;
  __l._M_array = &local_b8;
  local_38 = this_02;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_2e0,__l,&local_36a);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  return pvVar14;
}

Assistant:

std::vector<SingleMthdTest *> CPattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternSelect(opt, rnd(), "pattern_select", 5, cls, 0x30c),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 6, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 7, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 8, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 9, cls, 0x31c, 1),
		new MthdPatternColorY8(opt, rnd(), "pattern_color_y8", 10, cls, 0x400, 0x10),
		new MthdPatternColorR5G6B5(opt, rnd(), "pattern_color_r5g6b5", 12, cls, 0x500, 0x20),
		new MthdPatternColorR5G5B5(opt, rnd(), "pattern_color_r5g5b5", 11, cls, 0x600, 0x20),
		new MthdPatternColorR8G8B8(opt, rnd(), "pattern_color_r8g8b8", 13, cls, 0x700, 0x40),
	};
}